

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall
HModel::util_getRowBounds(HModel *this,int firstrow,int lastrow,double *XrowLower,double *XrowUpper)

{
  double dVar1;
  bool bVar2;
  reference pvVar3;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  HModel *in_RDI;
  long in_R8;
  int row;
  value_type local_48;
  value_type local_38;
  int local_24;
  
  for (local_24 = in_ESI; local_24 <= in_EDX; local_24 = local_24 + 1) {
    if (in_RCX != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->rowLower,(long)local_24);
      bVar2 = hsol_isInfinity(in_RDI,-*pvVar3);
      if (bVar2) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->rowLower,(long)local_24);
        local_38 = *pvVar3;
      }
      else {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->rowLower,(long)local_24);
        dVar1 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->rowScale,(long)local_24);
        local_38 = dVar1 * *pvVar3;
      }
      *(value_type *)(in_RCX + (long)(local_24 - in_ESI) * 8) = local_38;
    }
    if (in_R8 != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->rowUpper,(long)local_24);
      bVar2 = hsol_isInfinity(in_RDI,*pvVar3);
      if (bVar2) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->rowUpper,(long)local_24);
        local_48 = *pvVar3;
      }
      else {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->rowUpper,(long)local_24);
        dVar1 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->rowScale,(long)local_24);
        local_48 = dVar1 * *pvVar3;
      }
      *(value_type *)(in_R8 + (long)(local_24 - in_ESI) * 8) = local_48;
    }
  }
  return;
}

Assistant:

void HModel::util_getRowBounds(int firstrow, int lastrow, double* XrowLower, double* XrowUpper) {
  assert(0 <= firstrow);
  assert(firstrow <= lastrow);
  assert(lastrow < numRow);
  for (int row = firstrow; row <= lastrow; ++row) {
    if (XrowLower != NULL)
      XrowLower[row-firstrow] = (hsol_isInfinity(-rowLower[row]) ? rowLower[row]
				 : rowLower[row] * rowScale[row]);
    if (XrowUpper != NULL)
      XrowUpper[row-firstrow] = (hsol_isInfinity(rowUpper[row]) ? rowUpper[row]
				 : rowUpper[row] * rowScale[row]);
  }
}